

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

void list_directory_from_sftp_print(fxp_name *name)

{
  StripCtrlChars *sccpub;
  size_t sVar1;
  char *pcVar2;
  ptrlen str;
  
  sccpub = string_scc;
  pcVar2 = name->longname;
  sVar1 = strlen(pcVar2);
  str.len = sVar1;
  str.ptr = pcVar2;
  pcVar2 = stripctrl_string_ptrlen(sccpub,str);
  if (pcVar2 != (char *)0x0) {
    puts(pcVar2);
    safefree(pcVar2);
    return;
  }
  return;
}

Assistant:

void list_directory_from_sftp_print(struct fxp_name *name)
{
    with_stripctrl(san, name->longname)
        printf("%s\n", san);
}